

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multWithBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *x,
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *result)

{
  uint *puVar1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  undefined8 uVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  int iVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_d8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(result);
  if (0 < (int)((ulong)((long)(x->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(x->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar8 = 0;
    do {
      pSVar2 = (this->matrix).data[lVar8];
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      iVar6 = pSVar2->memused;
      if (0 < iVar6) {
        pNVar7 = pSVar2->m_elem;
        iVar6 = iVar6 + 1;
        do {
          pNVar5 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((x->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pNVar7->idx);
          local_98.val.m_backend.fpclass = cpp_dec_float_finite;
          local_98.val.m_backend.prec_elem = 10;
          local_98.val.m_backend.data._M_elems[0] = 0;
          local_98.val.m_backend.data._M_elems[1] = 0;
          local_98.val.m_backend.data._M_elems[2] = 0;
          local_98.val.m_backend.data._M_elems[3] = 0;
          local_98.val.m_backend.data._M_elems[4] = 0;
          local_98.val.m_backend.data._M_elems[5] = 0;
          local_98.val.m_backend.data._M_elems._24_5_ = 0;
          local_98.val.m_backend.data._M_elems[7]._1_3_ = 0;
          local_98.val.m_backend.data._M_elems._32_5_ = 0;
          local_98.val.m_backend.data._M_elems[9]._1_3_ = 0;
          local_98.val.m_backend.exp = 0;
          local_98.val.m_backend.neg = false;
          v = pNVar7;
          if ((&local_98 != pNVar5) && (v = pNVar5, pNVar7 != &local_98)) {
            uVar3 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
            local_98.val.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_98.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_98.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
            local_98.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
            local_98.val.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
            uVar3 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
            local_98.val.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_98.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_98.val.m_backend.exp = (pNVar7->val).m_backend.exp;
            local_98.val.m_backend.neg = (pNVar7->val).m_backend.neg;
            local_98.val.m_backend.fpclass = (pNVar7->val).m_backend.fpclass;
            local_98.val.m_backend.prec_elem = (pNVar7->val).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)&local_98,(cpp_dec_float<50U,_int,_void> *)v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_98);
          pNVar7 = pNVar7 + 1;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
      local_38 = CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
      local_58[0] = local_d8.data._M_elems[0];
      local_58[1] = local_d8.data._M_elems[1];
      auStack_50[0] = local_d8.data._M_elems[2];
      auStack_50[1] = local_d8.data._M_elems[3];
      local_48[0] = local_d8.data._M_elems[4];
      local_48[1] = local_d8.data._M_elems[5];
      uStack_40 = CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
      iVar6 = (result->super_IdxSet).num;
      (result->super_IdxSet).num = iVar6 + 1;
      (result->super_IdxSet).idx[iVar6] = (int)lVar8;
      pnVar4 = (result->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar4[lVar8].m_backend.data._M_elems + 8) = local_38;
      puVar1 = pnVar4[lVar8].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_d8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = uStack_40;
      *(undefined8 *)&pnVar4[lVar8].m_backend.data = local_d8.data._M_elems._0_8_;
      *(undefined8 *)(pnVar4[lVar8].m_backend.data._M_elems + 2) = local_d8.data._M_elems._8_8_;
      pnVar4[lVar8].m_backend.exp = local_d8.exp;
      pnVar4[lVar8].m_backend.neg = local_d8.neg;
      pnVar4[lVar8].m_backend.fpclass = local_d8.fpclass;
      pnVar4[lVar8].m_backend.prec_elem = local_d8.prec_elem;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)(x->
                                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(x->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multWithBase(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   result.clear();

   assert(matrixIsSetup);

   for(int i = 0; i < x.dim(); ++i)
      result.add(i, (*matrix[i]) * x);

   return;
}